

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

ON_LengthValue *
ON_LengthValue::CreateFromSubString
          (ON_LengthValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string,
          int string_count,wchar_t **string_end)

{
  ON_UnitSystem *pOVar1;
  ON_ParseSettings parse_settings_00;
  undefined3 uVar2;
  double dVar3;
  ON_wString *this;
  LengthUnitSystem length_unit_system;
  AngleUnitSystem AVar4;
  uint length;
  uint uVar5;
  double length_value;
  ON_ParseSettings parse_results;
  LengthUnitSystem local_81;
  ON_wString *local_80;
  ON_wString *local_78;
  double local_70;
  ON_UnitSystem local_68;
  ON_ParseSettings local_50;
  
  if (string_end != (wchar_t **)0x0) {
    *string_end = string;
  }
  if (string_count < -1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x94,"","Invalid string_count parameter.");
  }
  else if ((string_count != 0 && string != (wchar_t *)0x0) && (*string != L'\0')) {
    local_80 = (ON_wString *)ON_DBL_QNAN;
    local_70 = ON_DBL_QNAN;
    ON_ParseSettings::ON_ParseSettings(&local_50);
    local_81 = Unset;
    parse_settings_00.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = parse_settings.m_reserved_bits;
    parse_settings_00.m_context_locale_id = parse_settings.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
    parse_settings_00.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
    parse_settings_00.m_reserved = parse_settings.m_reserved;
    length = ON_ParseLengthExpression
                       (string,string_count,parse_settings_00,&local_70,&local_50,&local_81);
    if ((0 < (int)length) &&
       ((string_count == -1 || (int)length <= string_count && (!NAN(local_70))))) {
      __return_storage_ptr__->m_context_locale_id = 0;
      __return_storage_ptr__->m_context_angle_unit_system = Unset;
      dVar3 = ON_UnitSystem::Unset.m_meters_per_custom_unit;
      __return_storage_ptr__->m_string_format = ExactDecimal;
      pOVar1 = &__return_storage_ptr__->m_length_unit_system;
      uVar2 = ON_UnitSystem::Unset._1_3_;
      uVar5 = ON_UnitSystem::Unset.m_reserved;
      (__return_storage_ptr__->m_length_unit_system).m_unit_system =
           ON_UnitSystem::Unset.m_unit_system;
      *(undefined3 *)&(__return_storage_ptr__->m_length_unit_system).field_0x1 = uVar2;
      (__return_storage_ptr__->m_length_unit_system).m_reserved = uVar5;
      (__return_storage_ptr__->m_length_unit_system).m_meters_per_custom_unit = dVar3;
      local_78 = &(__return_storage_ptr__->m_length_unit_system).m_custom_unit_name;
      ON_wString::ON_wString(local_78,&ON_UnitSystem::Unset.m_custom_unit_name);
      __return_storage_ptr__->m_length = (double)local_80;
      local_80 = &__return_storage_ptr__->m_length_as_string;
      ON_wString::ON_wString(local_80);
      __return_storage_ptr__->m_length = local_70;
      if ((byte)(local_81 - Microns) < 0xfe) {
        ON_UnitSystem::ON_UnitSystem(&local_68,local_81);
        pOVar1->m_unit_system = local_68.m_unit_system;
        *(undefined3 *)&pOVar1->field_0x1 = local_68._1_3_;
        pOVar1->m_reserved = local_68.m_reserved;
        (__return_storage_ptr__->m_length_unit_system).m_meters_per_custom_unit =
             local_68.m_meters_per_custom_unit;
        ON_wString::operator=(local_78,&local_68.m_custom_unit_name);
      }
      else {
        length_unit_system = ON_ParseSettings::ContextLengthUnitSystem(&parse_settings);
        ON_UnitSystem::ON_UnitSystem(&local_68,length_unit_system);
        pOVar1->m_unit_system = local_68.m_unit_system;
        *(undefined3 *)&pOVar1->field_0x1 = local_68._1_3_;
        pOVar1->m_reserved = local_68.m_reserved;
        (__return_storage_ptr__->m_length_unit_system).m_meters_per_custom_unit =
             local_68.m_meters_per_custom_unit;
        ON_wString::operator=(local_78,&local_68.m_custom_unit_name);
      }
      ON_wString::~ON_wString(&local_68.m_custom_unit_name);
      this = local_80;
      AVar4 = ON_ParseSettings::ContextAngleUnitSystem(&parse_settings);
      __return_storage_ptr__->m_context_angle_unit_system = AVar4;
      uVar5 = ON_ParseSettings::ContextLocaleId(&parse_settings);
      __return_storage_ptr__->m_context_locale_id = uVar5;
      ON_wString::ON_wString((ON_wString *)&local_68,string,length);
      ON_wString::operator=(this,(ON_wString *)&local_68);
      ON_wString::~ON_wString((ON_wString *)&local_68);
      ON_wString::TrimLeftAndRight(this,(wchar_t *)0x0);
      if (string_end == (wchar_t **)0x0) {
        return __return_storage_ptr__;
      }
      *string_end = string + length;
      return __return_storage_ptr__;
    }
  }
  ON_LengthValue(__return_storage_ptr__,&Unset);
  return __return_storage_ptr__;
}

Assistant:

ON_LengthValue ON_LengthValue::CreateFromSubString(
    ON_ParseSettings parse_settings,
    const wchar_t* string,
    int string_count,
    const wchar_t** string_end
  )
{
  // All calls to some version of ON_LengthValue::CreateFrom*String(...) end up here.
  if (nullptr != string_end && &string != string_end)
    *string_end = string;

  if (string_count < -1)
  {
    ON_ERROR("Invalid string_count parameter.");
    return ON_LengthValue::Unset;
  }

  if (nullptr == string || 0 == string_count || 0 == string[0] )
  {
    // empty string fails silently.
    return ON_LengthValue::Unset;
  }

  double length_value = ON_DBL_QNAN;
  ON_ParseSettings parse_results;
  ON::LengthUnitSystem string_length_unit_system = ON::LengthUnitSystem::Unset;
  const int parse_count = ON_ParseLengthExpression(
    string,
    string_count,
    parse_settings, 
    &length_value,
    &parse_results,
    &string_length_unit_system
  );

  if ( parse_count <= 0 
    || (parse_count > string_count && string_count >= 0)
    || false == (length_value == length_value) 
    ) 
  {
    // Calling ON_ERROR HERE .NET wrapper trauma when CreateFromSubString() is used for string validation.
    // ON_ERROR("Input string parameter is not valid.");
    return ON_LengthValue::Unset;
  }

  ON_LengthValue rc;

  rc.m_length = length_value;

  if (ON::LengthUnitSystem::Unset != string_length_unit_system && ON::LengthUnitSystem::None != string_length_unit_system)
    rc.m_length_unit_system = ON_UnitSystem(string_length_unit_system);
  else
    rc.m_length_unit_system = ON_UnitSystem(parse_settings.ContextLengthUnitSystem());

  rc.m_context_angle_unit_system = parse_settings.ContextAngleUnitSystem();
  rc.m_context_locale_id = parse_settings.ContextLocaleId();

  rc.m_length_as_string = ON_wString(string, parse_count);
  rc.m_length_as_string.TrimLeftAndRight();

  if (nullptr != string_end)
    *string_end = string + parse_count;

  return rc;
}